

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O2

void __thiscall embree::cache_regression_test::cache_regression_test(cache_regression_test *this)

{
  long lVar1;
  RegressionTest *in_stack_ffffffffffffffb8;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"cache_regression_test",&local_39);
  RegressionTest::RegressionTest(&this->super_RegressionTest,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_021e1438;
  BarrierSys::BarrierSys(&this->barrier,0);
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  (this->threadIDCounter).super___atomic_base<int>._M_i = 0;
  lVar1 = 0x48;
  do {
    *(undefined8 *)((long)this->entry + lVar1 + -0x48) = 0;
    *(undefined1 *)
     ((long)&(((cache_regression_test *)(this->entry + -4))->super_RegressionTest).
             _vptr_RegressionTest + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x10048);
  registerRegressionTest(in_stack_ffffffffffffffb8);
  return;
}

Assistant:

cache_regression_test() 
      : RegressionTest("cache_regression_test"), numFailed(0), threadIDCounter(0)
    {
      registerRegressionTest(this);
    }